

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TextFlow::Column::iterator::iterator(iterator *this,Column *column)

{
  this->m_column = column;
  this->m_pos = 0;
  this->m_len = 0;
  *(undefined8 *)((long)&this->m_len + 1) = 0;
  *(undefined8 *)((long)&this->m_end + 1) = 0;
  if (column->m_width <= column->m_indent) {
    __assert_fail("m_column.m_width > m_column.m_indent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.cpp"
                  ,0x1740,"Catch::TextFlow::Column::iterator::iterator(const Column &)");
  }
  if (column->m_initialIndent < column->m_width || column->m_initialIndent == 0xffffffffffffffff) {
    calcLength(this);
    if (this->m_len == 0) {
      this->m_pos = (this->m_column->m_string)._M_string_length;
    }
    return;
  }
  __assert_fail("m_column.m_initialIndent == std::string::npos || m_column.m_width > m_column.m_initialIndent"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.cpp"
                ,0x1742,"Catch::TextFlow::Column::iterator::iterator(const Column &)");
}

Assistant:

Column::iterator::iterator(Column const &column) : m_column(column) {
            assert(m_column.m_width > m_column.m_indent);
            assert(m_column.m_initialIndent == std::string::npos ||
                m_column.m_width > m_column.m_initialIndent);
            calcLength();
            if (m_len == 0) {
                m_pos = m_column.m_string.size();
            }
        }